

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

void deqp::gls::FboUtil::config::glDelete(Image *cfg,GLuint img,Functions *gl)

{
  long local_40;
  long local_30;
  Functions *gl_local;
  Image *pIStack_10;
  GLuint img_local;
  Image *cfg_local;
  
  gl_local._4_4_ = img;
  pIStack_10 = cfg;
  if (cfg == (Image *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = __dynamic_cast(cfg,&Image::typeinfo,&Renderbuffer::typeinfo,0);
  }
  if (local_30 == 0) {
    if (pIStack_10 == (Image *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = __dynamic_cast(pIStack_10,&Image::typeinfo,&Texture::typeinfo,0);
    }
    if (local_40 != 0) {
      (*gl->deleteTextures)(1,(GLuint *)((long)&gl_local + 4));
    }
  }
  else {
    (*gl->deleteRenderbuffers)(1,(GLuint *)((long)&gl_local + 4));
  }
  return;
}

Assistant:

static void glDelete (const Image& cfg, GLuint img, const glw::Functions& gl)
{
	if (dynamic_cast<const Renderbuffer*>(&cfg) != DE_NULL)
		gl.deleteRenderbuffers(1, &img);
	else if (dynamic_cast<const Texture*>(&cfg) != DE_NULL)
		gl.deleteTextures(1, &img);
	else
		DE_FATAL("Impossible image type");
}